

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int getPixelFormat(int pixelSize,int flags)

{
  int iVar1;
  
  if (pixelSize == 1) {
    iVar1 = 6;
  }
  else {
    if (pixelSize == 4) {
      if ((flags & 0x40U) == 0) {
        return flags & 1U | 2;
      }
      return flags & 1U ^ 5;
    }
    if (pixelSize == 3) {
      return flags & 1;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int getPixelFormat(int pixelSize, int flags)
{
  if (pixelSize == 1) return TJPF_GRAY;
  if (pixelSize == 3) {
    if (flags & TJ_BGR) return TJPF_BGR;
    else return TJPF_RGB;
  }
  if (pixelSize == 4) {
    if (flags & TJ_ALPHAFIRST) {
      if (flags & TJ_BGR) return TJPF_XBGR;
      else return TJPF_XRGB;
    } else {
      if (flags & TJ_BGR) return TJPF_BGRX;
      else return TJPF_RGBX;
    }
  }
  return -1;
}